

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

int ctemplate_htmlparser::htmlparser_is_attr_quoted(htmlparser_ctx *ctx)

{
  int iVar1;
  
  iVar1 = statemachine_get_state(ctx->statemachine);
  return (int)(iVar1 - 0x11U < 4);
}

Assistant:

int htmlparser_is_attr_quoted(htmlparser_ctx *ctx) {
  int st = statemachine_get_state(ctx->statemachine);
  if (st == HTMLPARSER_STATE_INT_VALUE_Q_START ||
      st == HTMLPARSER_STATE_INT_VALUE_Q ||
      st == HTMLPARSER_STATE_INT_VALUE_DQ_START ||
      st == HTMLPARSER_STATE_INT_VALUE_DQ)
      return 1;
  else
      return 0;
}